

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Reverb::set(V2Reverb *this,syVReverb *para)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = 64.0 / (para->revtime + 1.0);
  fVar3 = fVar3 * fVar3 * this->inst->SRfclinfreq;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar2 = powf(set::gaincdef[lVar1],fVar3);
    this->gainc[lVar1] = fVar2;
  }
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    fVar2 = powf(set::gainadef[lVar1],fVar3);
    this->gaina[lVar1] = fVar2;
  }
  fVar3 = this->inst->SRfclinfreq;
  fVar2 = para->highcut;
  this->gainin = para->vol * 0.0078125;
  this->damp = fVar2 * 0.0078125 * fVar3;
  fVar2 = para->lowcut * 0.0078125;
  fVar2 = fVar2 * fVar2;
  this->lowcut = fVar2 * fVar2 * fVar3;
  return;
}

Assistant:

void set(const syVReverb *para)
    {
        static const float gaincdef[4] = {
            0.966384599f, 0.958186359f, 0.953783929f, 0.950933178f
        };
        static const float gainadef[2] = {
            0.994260075f, 0.998044717f
        };

        float e = inst->SRfclinfreq * sqr(64.0f / (para->revtime + 1.0f));
        for (int i=0; i < 4; i++)
            gainc[i] = powf(gaincdef[i], e);

        for (int i=0; i < 2; i++)
            gaina[i] = powf(gainadef[i], e);

        damp = inst->SRfclinfreq * (para->highcut / 128.0f);
        gainin = para->vol / 128.0f;
        lowcut = inst->SRfclinfreq * sqr(sqr(para->lowcut / 128.0f));
    }